

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

EncodingState * ZXing::Aztec::LatchAndAppend(EncodingState *state,int mode,int value)

{
  int iVar1;
  int iVar2;
  Token TVar3;
  const_reference pvVar4;
  int in_EDX;
  long in_RSI;
  EncodingState *in_RDI;
  int latchModeBitCount;
  int latch;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  int bitCount;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  Token in_stack_ffffffffffffff94;
  EncodingState *this;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = *(int *)(in_RSI + 0x20);
  this = in_RDI;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  if (in_EDX != *(int *)(in_RSI + 0x18)) {
    std::array<std::array<int,_5UL>,_5UL>::operator[]
              ((array<std::array<int,_5UL>,_5UL> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pvVar4 = std::array<int,_5UL>::operator[]
                       ((array<int,_5UL> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar1 = *pvVar4;
    in_stack_ffffffffffffff94 =
         Token::CreateSimple(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::push_back
              ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar2 = (iVar1 >> 0x10) + iVar2;
  }
  TVar3 = Token::CreateSimple(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::push_back
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(in_stack_ffffffffffffff94,TVar3),
             (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  in_RDI->mode = in_EDX;
  in_RDI->binaryShiftByteCount = 0;
  in_RDI->bitCount = iVar2 + (in_EDX == 2 ^ 5);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~vector(&this->tokens);
  return this;
}

Assistant:

static EncodingState LatchAndAppend(const EncodingState& state, int mode, int value)
{
	//assert binaryShiftByteCount == 0;
	int bitCount = state.bitCount;
	auto tokens = state.tokens;
	if (mode != state.mode) {
		int latch = LATCH_TABLE[state.mode][mode];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
	}
	int latchModeBitCount = mode == MODE_DIGIT ? 4 : 5;
	tokens.push_back(Token::CreateSimple(value, latchModeBitCount));
	return EncodingState{ tokens, mode, 0, bitCount + latchModeBitCount };
}